

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int str_char(lua_State *L)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int narg;
  bool bVar5;
  luaL_Buffer local_2048;
  
  local_2048.lvl = 0;
  iVar4 = (int)((ulong)((long)L->top - (long)L->base) >> 4);
  local_2048.p = local_2048.buffer;
  local_2048.L = L;
  if (0 < iVar4) {
    narg = 1;
    do {
      uVar3 = luaL_checkinteger(L,narg);
      if ((uVar3 & 0xffffff00) != 0) {
        luaL_argerror(L,narg,"invalid value");
      }
      if (&stack0xffffffffffffffd0 <= local_2048.p) {
        iVar2 = emptybuffer(&local_2048);
        if (iVar2 != 0) {
          adjuststack(&local_2048);
        }
      }
      pcVar1 = local_2048.p + 1;
      *local_2048.p = (char)uVar3;
      bVar5 = narg != iVar4;
      narg = narg + 1;
      local_2048.p = pcVar1;
    } while (bVar5);
  }
  emptybuffer(&local_2048);
  lua_concat(local_2048.L,local_2048.lvl);
  return 1;
}

Assistant:

static int str_char(lua_State*L){
int n=lua_gettop(L);
int i;
luaL_Buffer b;
luaL_buffinit(L,&b);
for(i=1;i<=n;i++){
int c=luaL_checkint(L,i);
luaL_argcheck(L,uchar(c)==c,i,"invalid value");
luaL_addchar(&b,uchar(c));
}
luaL_pushresult(&b);
return 1;
}